

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void die_on_amqp_error(amqp_rpc_reply_t x,char *context)

{
  if (x.reply_type == AMQP_RESPONSE_NORMAL) {
    return;
  }
  if (x.reply_type == AMQP_RESPONSE_NONE) {
    fprintf(_stderr,"%s: missing RPC reply type!\n",context);
  }
  else if (x.reply_type == AMQP_RESPONSE_LIBRARY_EXCEPTION) {
    die_on_amqp_error_cold_3();
  }
  else if (x.reply_type == AMQP_RESPONSE_SERVER_EXCEPTION) {
    if (x.reply.id == 0x140028) {
      die_on_amqp_error_cold_1();
    }
    else if (x.reply.id == 0xa0032) {
      die_on_amqp_error_cold_2();
    }
    else {
      fprintf(_stderr,"%s: unknown server error, method id 0x%08X\n",context);
    }
  }
  exit(1);
}

Assistant:

void die_on_amqp_error(amqp_rpc_reply_t x, char const *context)
{
  switch (x.reply_type) {
  case AMQP_RESPONSE_NORMAL:
    return;

  case AMQP_RESPONSE_NONE:
    fprintf(stderr, "%s: missing RPC reply type!\n", context);
    break;

  case AMQP_RESPONSE_LIBRARY_EXCEPTION:
    fprintf(stderr, "%s: %s\n", context, amqp_error_string2(x.library_error));
    break;

  case AMQP_RESPONSE_SERVER_EXCEPTION:
    switch (x.reply.id) {
    case AMQP_CONNECTION_CLOSE_METHOD: {
      amqp_connection_close_t *m = (amqp_connection_close_t *) x.reply.decoded;
      fprintf(stderr, "%s: server connection error %d, message: %.*s\n",
              context,
              m->reply_code,
              (int) m->reply_text.len, (char *) m->reply_text.bytes);
      break;
    }
    case AMQP_CHANNEL_CLOSE_METHOD: {
      amqp_channel_close_t *m = (amqp_channel_close_t *) x.reply.decoded;
      fprintf(stderr, "%s: server channel error %d, message: %.*s\n",
              context,
              m->reply_code,
              (int) m->reply_text.len, (char *) m->reply_text.bytes);
      break;
    }
    default:
      fprintf(stderr, "%s: unknown server error, method id 0x%08X\n", context, x.reply.id);
      break;
    }
    break;
  }

  exit(1);
}